

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18dr1.cpp
# Opt level: O1

int main(void)

{
  long lVar1;
  long lVar2;
  uint32_t result;
  int iVar3;
  long lVar4;
  int aa [10];
  int local_28 [10];
  
  f(ga,10);
  lVar2 = 0;
  do {
    lVar1 = lVar2 + 1;
    iVar3 = 1;
    lVar4 = -1;
    do {
      iVar3 = iVar3 * ((int)lVar4 + 2);
      lVar4 = lVar4 + 1;
    } while (lVar2 != lVar4);
    local_28[lVar2] = iVar3;
    lVar2 = lVar1;
  } while (lVar1 != 10);
  f(local_28,10);
  return 0;
}

Assistant:

int main() { 
    constexpr uint32_t size = 10;
    f(ga, size);
    int aa[size];
    for (size_t count = 0; count < size; count++) {
        aa[count] = fact(count + 1);
    }
    f(aa, size);
}